

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O3

bool __thiscall
graphics101::HalfEdgeTriMesh::vertex_is_boundary(HalfEdgeTriMesh *this,Index vertex_index)

{
  pointer pHVar1;
  ulong uVar2;
  pointer pHVar3;
  ulong uVar4;
  
  pHVar1 = (this->m_vertex_halfedges).
           super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)vertex_index <
      (ulong)((long)(this->m_vertex_halfedges).
                    super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 3)) {
    uVar2 = pHVar1[vertex_index].value;
    pHVar3 = (this->m_halfedges).
             super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->m_halfedges).
                   super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3) *
            -0x3333333333333333;
    if (uVar2 <= uVar4 && uVar4 - uVar2 != 0) {
      return pHVar3[uVar2].face == -1;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

bool HalfEdgeTriMesh::vertex_is_boundary( const Index vertex_index ) const
{
    return -1 == halfedge( outgoing_halfedge_index_for_vertex( vertex_index ) ).face;
}